

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O0

void __thiscall
amrex::ParmParse::getktharr
          (ParmParse *this,char *name,int k,vector<long,_std::allocator<long>_> *ptr,int start_ix,
          int num_val)

{
  string *in_RSI;
  long in_RDI;
  int in_stack_ffffffffffffff5c;
  vector<long,_std::allocator<long>_> *ptr_00;
  allocator *table;
  allocator local_69;
  string local_68 [16];
  string *in_stack_ffffffffffffffa8;
  ParmParse *in_stack_ffffffffffffffb0;
  string local_48 [72];
  
  ptr_00 = *(vector<long,_std::allocator<long>_> **)(in_RDI + 0x50);
  table = &local_69;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,(char *)in_RSI,table);
  prefixedName(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  anon_unknown_12::anon_unknown_0::sgetarr<long>
            ((Table *)table,in_RSI,ptr_00,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
             in_stack_ffffffffffffff5c);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  return;
}

Assistant:

void
ParmParse::getktharr (const char* name,
                      int         k,
                      std::vector<long>& ptr,
                      int         start_ix,
                      int         num_val) const
{
    sgetarr(m_table, prefixedName(name),ptr,start_ix,num_val,k);
}